

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3RunParser(Parse *pParse,char *zSql,char **pzErrMsg)

{
  uchar *z;
  u8 uVar1;
  sqlite3 *db;
  Table *pTable;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  bool bVar6;
  int iVar7;
  char **ppcVar8;
  uint uVar9;
  yyParser *pParser;
  char *pcVar10;
  int iVar11;
  int iVar12;
  AutoincInfo *p;
  int iVar13;
  long lVar14;
  Token yyminor;
  Token yyminor_00;
  Token yyminor_01;
  int tokenType;
  int local_3c;
  char **local_38;
  
  db = pParse->db;
  iVar12 = db->aLimit[1];
  if (db->activeVdbeCnt == 0) {
    (db->u1).isInterrupted = 0;
  }
  pParse->rc = 0;
  pParse->zTail = zSql;
  pParser = (yyParser *)sqlite3Malloc(0xc90);
  if (pParser == (yyParser *)0x0) {
    db->mallocFailed = '\x01';
    iVar12 = 7;
  }
  else {
    pParser->yyidx = -1;
    uVar1 = (db->lookaside).bEnabled;
    if ((db->lookaside).pStart != (void *)0x0) {
      (db->lookaside).bEnabled = '\x01';
    }
    bVar6 = true;
    local_38 = pzErrMsg;
    if (db->mallocFailed == '\0') {
      iVar11 = -1;
      iVar13 = 0;
      do {
        if (zSql[iVar13] == '\0') break;
        z = (uchar *)(zSql + iVar13);
        (pParse->sLastToken).z = (char *)z;
        uVar9 = sqlite3GetToken(z,&local_3c);
        ppcVar8 = local_38;
        iVar7 = local_3c;
        (pParse->sLastToken).n = uVar9;
        iVar13 = iVar13 + uVar9;
        if (iVar12 < iVar13) {
          pParse->rc = 0x12;
          iVar12 = 0;
          goto LAB_001252f9;
        }
        if (local_3c == 1) {
          pParse->zTail = zSql + iVar13;
LAB_00125459:
          yyminor_01.n = uVar9;
          yyminor_01.z = (char *)z;
          yyminor_01._12_4_ = 0;
          sqlite3Parser(pParser,local_3c,yyminor_01,pParse);
          iVar11 = iVar7;
          if (pParse->rc != 0) {
            iVar12 = 0;
            goto LAB_001252f9;
          }
        }
        else {
          if (local_3c != 0x95) {
            if (local_3c != 0x94) goto LAB_00125459;
            sqlite3DbFree(db,*local_38);
            bVar6 = false;
            pcVar10 = sqlite3MPrintf(db,"unrecognized token: \"%T\"",&pParse->sLastToken);
            *ppcVar8 = pcVar10;
            iVar12 = 1;
            goto LAB_001252f9;
          }
          if ((db->u1).isInterrupted != 0) {
            iVar12 = 0;
            sqlite3ErrorMsg(pParse,"interrupt");
            pParse->rc = 9;
            goto LAB_001252f9;
          }
        }
      } while (db->mallocFailed == '\0');
    }
    else {
      iVar13 = 0;
      iVar11 = -1;
    }
    iVar12 = 0;
LAB_001252f9:
    if (((bVar6) && (zSql[iVar13] == '\0')) && (pParse->rc == 0)) {
      if (iVar11 != 1) {
        uVar2 = (pParse->sLastToken).z;
        uVar3 = (pParse->sLastToken).n;
        yyminor.n = uVar3;
        yyminor.z = (char *)uVar2;
        yyminor._12_4_ = 0;
        sqlite3Parser(pParser,1,yyminor,pParse);
        pParse->zTail = zSql + iVar13;
      }
      uVar4 = (pParse->sLastToken).z;
      uVar5 = (pParse->sLastToken).n;
      yyminor_00.n = uVar5;
      yyminor_00.z = (char *)uVar4;
      yyminor_00._12_4_ = 0;
      sqlite3Parser(pParser,0,yyminor_00,pParse);
    }
    while (-1 < pParser->yyidx) {
      yy_pop_parser_stack(pParser);
    }
    sqlite3_free(pParser);
    (db->lookaside).bEnabled = uVar1;
    if (db->mallocFailed != '\0') {
      pParse->rc = 7;
    }
    uVar9 = pParse->rc;
    if (((uVar9 != 0) && (uVar9 != 0x65)) && (pParse->zErrMsg == (char *)0x0)) {
      if (uVar9 == 0x204) {
        pcVar10 = "abort due to ROLLBACK";
      }
      else if ((ulong)(byte)uVar9 == 2 || 0x1a < (uVar9 & 0xff)) {
        pcVar10 = "unknown error";
      }
      else {
        pcVar10 = *(char **)(sqlite3ErrStr_aMsg + (ulong)(byte)uVar9 * 8);
      }
      sqlite3SetString(&pParse->zErrMsg,db,"%s",pcVar10);
    }
    if (pParse->zErrMsg != (char *)0x0) {
      *local_38 = pParse->zErrMsg;
      sqlite3_log(pParse->rc,"%s");
      pParse->zErrMsg = (char *)0x0;
      iVar12 = iVar12 + 1;
    }
    if (((pParse->pVdbe != (Vdbe *)0x0) && (0 < pParse->nErr)) && (pParse->nested == '\0')) {
      sqlite3VdbeDelete(pParse->pVdbe);
      pParse->pVdbe = (Vdbe *)0x0;
    }
    if (pParse->nested == '\0') {
      sqlite3DbFree(db,pParse->aTableLock);
      pParse->aTableLock = (TableLock *)0x0;
      pParse->nTableLock = 0;
    }
    sqlite3_free(pParse->apVtabLock);
    if (pParse->declareVtab == '\0') {
      sqlite3DeleteTable(db,pParse->pNewTable);
    }
    sqlite3DeleteTrigger(db,pParse->pNewTrigger);
    if (0 < (long)pParse->nzVar) {
      lVar14 = (long)pParse->nzVar + 1;
      do {
        sqlite3DbFree(db,pParse->azVar[lVar14 + -2]);
        lVar14 = lVar14 + -1;
      } while (1 < lVar14);
    }
    sqlite3DbFree(db,pParse->azVar);
    p = (AutoincInfo *)pParse->aAlias;
    while( true ) {
      sqlite3DbFree(db,p);
      p = pParse->pAinc;
      if (p == (AutoincInfo *)0x0) break;
      pParse->pAinc = p->pNext;
    }
    while (pTable = pParse->pZombieTab, pTable != (Table *)0x0) {
      pParse->pZombieTab = pTable->pNextZombie;
      sqlite3DeleteTable(db,pTable);
    }
    if ((iVar12 != 0) && (pParse->rc == 0)) {
      pParse->rc = 1;
    }
  }
  return iVar12;
}

Assistant:

SQLITE_PRIVATE int sqlite3RunParser(Parse *pParse, const char *zSql, char **pzErrMsg){
  int nErr = 0;                   /* Number of errors encountered */
  int i;                          /* Loop counter */
  void *pEngine;                  /* The LEMON-generated LALR(1) parser */
  int tokenType;                  /* type of the next token */
  int lastTokenParsed = -1;       /* type of the previous token */
  u8 enableLookaside;             /* Saved value of db->lookaside.bEnabled */
  sqlite3 *db = pParse->db;       /* The database connection */
  int mxSqlLen;                   /* Max length of an SQL string */


  mxSqlLen = db->aLimit[SQLITE_LIMIT_SQL_LENGTH];
  if( db->activeVdbeCnt==0 ){
    db->u1.isInterrupted = 0;
  }
  pParse->rc = SQLITE_OK;
  pParse->zTail = zSql;
  i = 0;
  assert( pzErrMsg!=0 );
  pEngine = sqlite3ParserAlloc((void*(*)(size_t))sqlite3Malloc);
  if( pEngine==0 ){
    db->mallocFailed = 1;
    return SQLITE_NOMEM;
  }
  assert( pParse->pNewTable==0 );
  assert( pParse->pNewTrigger==0 );
  assert( pParse->nVar==0 );
  assert( pParse->nzVar==0 );
  assert( pParse->azVar==0 );
  enableLookaside = db->lookaside.bEnabled;
  if( db->lookaside.pStart ) db->lookaside.bEnabled = 1;
  while( !db->mallocFailed && zSql[i]!=0 ){
    assert( i>=0 );
    pParse->sLastToken.z = &zSql[i];
    pParse->sLastToken.n = sqlite3GetToken((unsigned char*)&zSql[i],&tokenType);
    i += pParse->sLastToken.n;
    if( i>mxSqlLen ){
      pParse->rc = SQLITE_TOOBIG;
      break;
    }
    switch( tokenType ){
      case TK_SPACE: {
        if( db->u1.isInterrupted ){
          sqlite3ErrorMsg(pParse, "interrupt");
          pParse->rc = SQLITE_INTERRUPT;
          goto abort_parse;
        }
        break;
      }
      case TK_ILLEGAL: {
        sqlite3DbFree(db, *pzErrMsg);
        *pzErrMsg = sqlite3MPrintf(db, "unrecognized token: \"%T\"",
                        &pParse->sLastToken);
        nErr++;
        goto abort_parse;
      }
      case TK_SEMI: {
        pParse->zTail = &zSql[i];
        /* Fall thru into the default case */
      }
      default: {
        sqlite3Parser(pEngine, tokenType, pParse->sLastToken, pParse);
        lastTokenParsed = tokenType;
        if( pParse->rc!=SQLITE_OK ){
          goto abort_parse;
        }
        break;
      }
    }
  }
abort_parse:
  if( zSql[i]==0 && nErr==0 && pParse->rc==SQLITE_OK ){
    if( lastTokenParsed!=TK_SEMI ){
      sqlite3Parser(pEngine, TK_SEMI, pParse->sLastToken, pParse);
      pParse->zTail = &zSql[i];
    }
    sqlite3Parser(pEngine, 0, pParse->sLastToken, pParse);
  }
#ifdef YYTRACKMAXSTACKDEPTH
  sqlite3StatusSet(SQLITE_STATUS_PARSER_STACK,
      sqlite3ParserStackPeak(pEngine)
  );
#endif /* YYDEBUG */
  sqlite3ParserFree(pEngine, sqlite3_free);
  db->lookaside.bEnabled = enableLookaside;
  if( db->mallocFailed ){
    pParse->rc = SQLITE_NOMEM;
  }
  if( pParse->rc!=SQLITE_OK && pParse->rc!=SQLITE_DONE && pParse->zErrMsg==0 ){
    sqlite3SetString(&pParse->zErrMsg, db, "%s", sqlite3ErrStr(pParse->rc));
  }
  assert( pzErrMsg!=0 );
  if( pParse->zErrMsg ){
    *pzErrMsg = pParse->zErrMsg;
    sqlite3_log(pParse->rc, "%s", *pzErrMsg);
    pParse->zErrMsg = 0;
    nErr++;
  }
  if( pParse->pVdbe && pParse->nErr>0 && pParse->nested==0 ){
    sqlite3VdbeDelete(pParse->pVdbe);
    pParse->pVdbe = 0;
  }
#ifndef SQLITE_OMIT_SHARED_CACHE
  if( pParse->nested==0 ){
    sqlite3DbFree(db, pParse->aTableLock);
    pParse->aTableLock = 0;
    pParse->nTableLock = 0;
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  sqlite3_free(pParse->apVtabLock);
#endif

  if( !IN_DECLARE_VTAB ){
    /* If the pParse->declareVtab flag is set, do not delete any table 
    ** structure built up in pParse->pNewTable. The calling code (see vtab.c)
    ** will take responsibility for freeing the Table structure.
    */
    sqlite3DeleteTable(db, pParse->pNewTable);
  }

  sqlite3DeleteTrigger(db, pParse->pNewTrigger);
  for(i=pParse->nzVar-1; i>=0; i--) sqlite3DbFree(db, pParse->azVar[i]);
  sqlite3DbFree(db, pParse->azVar);
  sqlite3DbFree(db, pParse->aAlias);
  while( pParse->pAinc ){
    AutoincInfo *p = pParse->pAinc;
    pParse->pAinc = p->pNext;
    sqlite3DbFree(db, p);
  }
  while( pParse->pZombieTab ){
    Table *p = pParse->pZombieTab;
    pParse->pZombieTab = p->pNextZombie;
    sqlite3DeleteTable(db, p);
  }
  if( nErr>0 && pParse->rc==SQLITE_OK ){
    pParse->rc = SQLITE_ERROR;
  }
  return nErr;
}